

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotation_t *
opengv::relative_pose::eigensolver
          (RelativeAdapterBase *adapter,Indices *indices,eigensolverOutput_t *output,bool useWeights
          )

{
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *pMVar1;
  int iVar2;
  Scalar *pSVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RCX;
  Indices *in_RDX;
  Indices *in_RSI;
  rotation_t *in_RDI;
  byte in_R8B;
  __type _Var4;
  double dVar5;
  ReturnType RVar6;
  Matrix3d *in_stack_000000b8;
  Matrix3d *in_stack_000000c0;
  Matrix3d *in_stack_000000c8;
  Vector3d opticalFlow;
  eigensolverOutput_t *in_stack_000000f0;
  bearingVector_t f2;
  bearingVector_t f1;
  double weight;
  Matrix3d F;
  bearingVector_t f2_1;
  bearingVector_t f1_1;
  size_t i_1;
  size_t i;
  double norm;
  Matrix3d zxF;
  Matrix3d yzF;
  Matrix3d xyF;
  Matrix3d zzF;
  Matrix3d yyF;
  Matrix3d xxF;
  size_t numberCorrespondences;
  EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
  *in_stack_fffffffffffff978;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff980;
  Indices *pIVar7;
  Indices *in_stack_fffffffffffff988;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff998;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff9a0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff9a8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff9c0;
  double *in_stack_fffffffffffff9c8;
  undefined1 local_590 [24];
  undefined1 local_578 [24];
  double local_560;
  double local_4f8;
  double local_490;
  double local_428;
  double local_3c0;
  double local_358;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *local_2f0;
  non_const_type local_2e8;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_2e0;
  undefined1 local_288 [24];
  undefined1 local_270 [24];
  ulong local_258;
  ulong local_250;
  double local_248;
  size_t local_30;
  byte local_21;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_20;
  Indices *local_10;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = Indices::size(in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff978);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff978);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff978);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff978);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff978);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff978);
  local_248 = 0.0;
  for (local_250 = 0; pIVar7 = local_10, local_250 < local_30; local_250 = local_250 + 1) {
    iVar2 = Indices::operator[](in_stack_fffffffffffff988,
                                (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
    (**(code **)(*(long *)pIVar7 + 0x20))(pIVar7,(long)iVar2);
    _Var4 = std::pow<double,int>
                      ((double)in_stack_fffffffffffff980,
                       (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
    local_248 = _Var4 + local_248;
  }
  local_248 = sqrt(local_248);
  for (local_258 = 0; pIVar7 = local_10, local_258 < local_30; local_258 = local_258 + 1) {
    iVar2 = Indices::operator[](in_stack_fffffffffffff988,
                                (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
    (**(code **)(*(long *)pIVar7 + 0x10))(local_270,pIVar7,(long)iVar2);
    pIVar7 = local_10;
    iVar2 = Indices::operator[](in_stack_fffffffffffff988,
                                (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
    (**(code **)(*(long *)pIVar7 + 0x18))(local_288,pIVar7,(long)iVar2);
    local_2e8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff978);
    local_2e0 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                          (in_stack_fffffffffffff980,
                           (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                           in_stack_fffffffffffff978);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,in_stack_fffffffffffff978)
    ;
    pIVar7 = local_10;
    local_2f0 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)0x3ff0000000000000;
    if ((local_21 & 1) != 0) {
      iVar2 = Indices::operator[](in_stack_fffffffffffff988,
                                  (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
      dVar5 = (double)(**(code **)(*(long *)pIVar7 + 0x20))(pIVar7,(long)iVar2);
      local_2f0 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)(dVar5 / local_248);
    }
    pMVar1 = local_2f0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    in_stack_fffffffffffff998 =
         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)((double)pMVar1 * *pSVar3);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    local_358 = (double)in_stack_fffffffffffff998 * *pSVar3;
    Eigen::operator*(in_stack_fffffffffffff9c8,(StorageBaseType *)in_stack_fffffffffffff9c0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_fffffffffffff978);
    in_stack_fffffffffffff9a0 = local_2f0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    in_stack_fffffffffffff9a8 =
         (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
         ((double)in_stack_fffffffffffff9a0 * *pSVar3);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    local_3c0 = (double)in_stack_fffffffffffff9a8 * *pSVar3;
    Eigen::operator*(in_stack_fffffffffffff9c8,(StorageBaseType *)in_stack_fffffffffffff9c0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_fffffffffffff978);
    pMVar1 = local_2f0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    dVar5 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    local_428 = (double)pMVar1 * dVar5 * *pSVar3;
    Eigen::operator*(in_stack_fffffffffffff9c8,(StorageBaseType *)in_stack_fffffffffffff9c0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_fffffffffffff978);
    in_stack_fffffffffffff9c0 = local_2f0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    in_stack_fffffffffffff9c8 = (double *)((double)in_stack_fffffffffffff9c0 * *pSVar3);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    local_490 = (double)in_stack_fffffffffffff9c8 * *pSVar3;
    Eigen::operator*(in_stack_fffffffffffff9c8,(StorageBaseType *)in_stack_fffffffffffff9c0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_fffffffffffff978);
    pMVar1 = local_2f0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    dVar5 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    local_4f8 = (double)pMVar1 * dVar5 * *pSVar3;
    Eigen::operator*(in_stack_fffffffffffff9c8,(StorageBaseType *)in_stack_fffffffffffff9c0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_fffffffffffff978);
    pMVar1 = local_2f0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    dVar5 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff980,(Index)in_stack_fffffffffffff978);
    local_560 = (double)pMVar1 * dVar5 * *pSVar3;
    Eigen::operator*(in_stack_fffffffffffff9c8,(StorageBaseType *)in_stack_fffffffffffff9c0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff980,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_fffffffffffff978);
  }
  modules::eigensolver_main
            ((Matrix3d *)
             opticalFlow.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2],
             (Matrix3d *)
             opticalFlow.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[1],
             (Matrix3d *)
             opticalFlow.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0],in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000f0
            );
  pIVar7 = local_10;
  iVar2 = Indices::operator[](in_stack_fffffffffffff988,(int)((ulong)local_10 >> 0x20));
  (**(code **)(*(long *)pIVar7 + 0x10))(local_578,pIVar7,(long)iVar2);
  iVar2 = Indices::operator[](local_10,(int)((ulong)pIVar7 >> 0x20));
  (**(code **)(*(long *)local_10 + 0x18))(local_590,local_10,(long)iVar2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)pIVar7,local_20);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar7,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)local_20);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff9a8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff9a0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar7,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_20);
  RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)pIVar7,local_20);
  if (RVar6 < 0.0) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-(in_stack_fffffffffffff998);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar7,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_20);
  }
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)pIVar7,(Matrix<double,_3,_3,_0,_3,_3> *)local_20);
  return in_RDI;
}

Assistant:

rotation_t eigensolver(
    const RelativeAdapterBase & adapter,
    const Indices & indices,
    eigensolverOutput_t & output,
    bool useWeights )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 4);

  Eigen::Matrix3d xxF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d xyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zxF = Eigen::Matrix3d::Zero();

  //compute the norm of all the scores
  double norm = 0.0;
  for(size_t i=0; i < numberCorrespondences; i++)
    norm += pow(adapter.getWeight(indices[i]),2);
  norm = sqrt(norm);

  //Fill summation terms
  for(size_t i=0; i < numberCorrespondences; i++)
  {
    bearingVector_t f1 = adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 = adapter.getBearingVector2(indices[i]);
    Eigen::Matrix3d F = f2*f2.transpose();
    
    double weight = 1.0;
    if( useWeights )
      weight = adapter.getWeight(indices[i])/norm;

    xxF = xxF + weight*f1[0]*f1[0]*F;
    yyF = yyF + weight*f1[1]*f1[1]*F;
    zzF = zzF + weight*f1[2]*f1[2]*F;
    xyF = xyF + weight*f1[0]*f1[1]*F;
    yzF = yzF + weight*f1[1]*f1[2]*F;
    zxF = zxF + weight*f1[2]*f1[0]*F;
  }

  //Do minimization
  modules::eigensolver_main(xxF,yyF,zzF,xyF,yzF,zxF,output);

  //Correct the translation
  bearingVector_t f1 = adapter.getBearingVector1(indices[0]);
  bearingVector_t f2 = adapter.getBearingVector2(indices[0]);
  f2 = output.rotation * f2;
  Eigen::Vector3d opticalFlow = f1 - f2;
  if( opticalFlow.dot(output.translation) < 0.0 )
    output.translation = -output.translation;

  return output.rotation;
}